

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_table.hpp
# Opt level: O3

int Omega_h::get_nrows<Omega_h::Action>(Table<Omega_h::Action> *t)

{
  int iVar1;
  ulong uVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  iVar1 = t->ncols;
  if (iVar1 < 1) {
    pcVar4 = "t.ncols > 0";
    uVar3 = 0x18;
  }
  else {
    uVar2 = (ulong)((long)(t->data).
                          super__Vector_base<Omega_h::Action,_std::allocator<Omega_h::Action>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(t->data).
                         super__Vector_base<Omega_h::Action,_std::allocator<Omega_h::Action>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 3;
    uVar2 = (ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff;
    if ((int)((long)uVar2 % (long)iVar1) == 0) {
      return (int)((long)uVar2 / (long)iVar1);
    }
    pcVar4 = "size(t.data) % t.ncols == 0";
    uVar3 = 0x19;
  }
  fail("assertion %s failed at %s +%d\n",pcVar4,
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_table.hpp"
       ,uVar3);
}

Assistant:

int get_nrows(Table<T> const& t) {
  OMEGA_H_CHECK(t.ncols > 0);
  OMEGA_H_CHECK(size(t.data) % t.ncols == 0);
  return size(t.data) / t.ncols;
}